

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

ArgumentMismatch *
CLI::ArgumentMismatch::AtLeast
          (ArgumentMismatch *__return_storage_ptr__,string *name,int num,size_t received)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  bool bVar6;
  uint uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  uint uVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  size_t sVar11;
  ulong uVar12;
  uint uVar13;
  undefined8 uVar14;
  uint uVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string __str_2;
  string __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  pcVar4 = (name->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar4,pcVar4 + name->_M_string_length);
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_f0,": At least ");
  uVar13 = -num;
  if (0 < num) {
    uVar13 = num;
  }
  uVar15 = 1;
  if (9 < uVar13) {
    uVar12 = (ulong)uVar13;
    uVar7 = 4;
    do {
      uVar15 = uVar7;
      uVar9 = (uint)uVar12;
      if (uVar9 < 100) {
        uVar15 = uVar15 - 2;
        goto LAB_00243dcd;
      }
      if (uVar9 < 1000) {
        uVar15 = uVar15 - 1;
        goto LAB_00243dcd;
      }
      if (uVar9 < 10000) goto LAB_00243dcd;
      uVar12 = uVar12 / 10000;
      uVar7 = uVar15 + 4;
    } while (99999 < uVar9);
    uVar15 = uVar15 + 1;
  }
LAB_00243dcd:
  paVar3 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar3;
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_50,(ulong)(uVar15 + -(num >> 0x1f)),'-');
  ::std::__detail::__to_chars_10_impl<unsigned_int>
            (local_50._M_dataplus._M_p + (uint)-(num >> 0x1f),uVar15,uVar13);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    uVar14 = local_f0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_50._M_string_length + local_f0._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar3) {
      uVar14 = local_50.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_50._M_string_length + local_f0._M_string_length) goto LAB_00243e56;
    pbVar8 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_50,0,0,local_f0._M_dataplus._M_p,local_f0._M_string_length);
  }
  else {
LAB_00243e56:
    pbVar8 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_f0,local_50._M_dataplus._M_p,local_50._M_string_length);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar1 = &pbVar8->field_2;
  if (paVar10 == paVar1) {
    local_d0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_d0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_d0._M_dataplus._M_p = (pointer)paVar10;
  }
  local_d0._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar8->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  pbVar8 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_d0," required but received ");
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == paVar10) {
    local_70.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_70._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_70.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_70._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  uVar13 = 1;
  if (9 < received) {
    sVar11 = received;
    uVar15 = 4;
    do {
      uVar13 = uVar15;
      if (sVar11 < 100) {
        uVar13 = uVar13 - 2;
        goto LAB_00243f77;
      }
      if (sVar11 < 1000) {
        uVar13 = uVar13 - 1;
        goto LAB_00243f77;
      }
      if (sVar11 < 10000) goto LAB_00243f77;
      bVar6 = 99999 < sVar11;
      sVar11 = sVar11 / 10000;
      uVar15 = uVar13 + 4;
    } while (bVar6);
    uVar13 = uVar13 + 1;
  }
LAB_00243f77:
  paVar10 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar10;
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_90,(ulong)uVar13,'\0');
  ::std::__detail::__to_chars_10_impl<unsigned_long>
            (local_90._M_dataplus._M_p,(uint)local_90._M_string_length,received);
  uVar12 = CONCAT44(local_90._M_string_length._4_4_,(uint)local_90._M_string_length) +
           local_70._M_string_length;
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    uVar14 = local_70.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < uVar12) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar10) {
      uVar14 = local_90.field_2._M_allocated_capacity;
    }
    if (uVar12 <= (ulong)uVar14) {
      pbVar8 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_90,0,0,local_70._M_dataplus._M_p,local_70._M_string_length);
      goto LAB_00244006;
    }
  }
  pbVar8 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_70,local_90._M_dataplus._M_p,
                     CONCAT44(local_90._M_string_length._4_4_,(uint)local_90._M_string_length));
LAB_00244006:
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar8->_M_dataplus)._M_p;
  paVar2 = &pbVar8->field_2;
  if (paVar5 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)paVar2) {
    local_b0.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_b0.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_b0._M_dataplus._M_p = (pointer)paVar5;
  }
  local_b0._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar2;
  pbVar8->_M_string_length = 0;
  paVar2->_M_local_buf[0] = '\0';
  ArgumentMismatch(__return_storage_ptr__,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar10) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar3) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static ArgumentMismatch AtLeast(std::string name, int num, std::size_t received) {
        return ArgumentMismatch(name + ": At least " + std::to_string(num) + " required but received " +
                                std::to_string(received));
    }